

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

Vec_Int_t * Wln_NtkRetime(Wln_Ntk_t *pNtk,int fSkipSimple,int fVerbose)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Wln_Ret_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  bool bVar8;
  bool bVar9;
  Vec_Int_t t;
  int fBackward;
  int fForward;
  int DelayMaxPrev;
  int nChange;
  int DelayBest;
  int DelayInit;
  int nCountIncrease;
  int fPrevBwd;
  int fPrevFwd;
  int nMoves;
  Vec_Int_t *vMoves;
  Vec_Int_t *vFront;
  Vec_Int_t *vSinks;
  Vec_Int_t *vSources;
  Wln_Ret_t *p;
  int fVerbose_local;
  int fSkipSimple_local;
  Wln_Ntk_t *pNtk_local;
  
  p_00 = Wln_RetAlloc(pNtk);
  p_01 = &p_00->vSources;
  p_02 = &p_00->vSinks;
  p_03 = &p_00->vFront;
  p_04 = Vec_IntAlloc(0);
  fPrevBwd = 0;
  bVar2 = false;
  bVar3 = false;
  DelayBest = 0;
  fForward = 0;
  Wln_RetPrint(p_00,fVerbose);
  Wln_RetMarkChanges(p_00,(Vec_Int_t *)0x0);
  uVar4 = Wln_RetPropDelay(p_00);
  p_00->DelayMax = uVar4;
  Wln_RetFindSources(p_00);
  Wln_RetAddToMoves(p_00,(Vec_Int_t *)0x0,p_00->DelayMax,0,0,fSkipSimple,fVerbose);
  DelayMaxPrev = uVar4;
  while( true ) {
    iVar5 = Vec_IntSize(p_01);
    bVar8 = true;
    if (iVar5 == 0) {
      iVar5 = Vec_IntSize(p_02);
      bVar8 = iVar5 != 0;
    }
    if (!bVar8) goto LAB_003f8846;
    iVar5 = p_00->DelayMax;
    iVar6 = Vec_IntSize(p_01);
    bVar8 = false;
    if (iVar6 != 0) {
      iVar6 = Wln_RetCheckForward(p_00,p_01);
      bVar8 = iVar6 != 0;
    }
    iVar6 = Vec_IntSize(p_02);
    bVar9 = false;
    if (iVar6 != 0) {
      iVar6 = Wln_RetCheckBackward(p_00,p_02);
      bVar9 = iVar6 != 0;
    }
    Vec_IntSort(p_01,0);
    Vec_IntSort(p_02,0);
    if ((!bVar8) && (!bVar9)) break;
    iVar6 = Vec_IntTwoCountCommon(p_01,p_02);
    if (iVar6 != 0) {
      printf("Cannot reduce delay by retiming.\n");
      goto LAB_003f8846;
    }
    fPrevBwd = fPrevBwd + 1;
    Vec_IntClear(p_03);
    if ((bVar2) && (bVar8)) {
LAB_003f8672:
      Vec_IntAppend(p_03,p_01);
      Wln_RetMarkChanges(p_00,p_03);
      Wln_RetRetimeForward(p_00,p_03);
      iVar6 = Wln_RetPropDelay(p_00);
      p_00->DelayMax = iVar6;
      t.pArray._4_4_ = 1;
      bVar2 = true;
    }
    else {
      if ((!bVar3) || (!bVar9)) {
        if ((bVar8) && (!bVar9)) goto LAB_003f8672;
        if ((bVar8) && (bVar9)) {
          iVar6 = Vec_IntSize(p_01);
          iVar7 = Vec_IntSize(p_02);
          if (iVar6 < iVar7) goto LAB_003f8672;
        }
      }
      Vec_IntAppend(p_03,p_02);
      Wln_RetRetimeBackward(p_00,p_03);
      Wln_RetMarkChanges(p_00,p_03);
      iVar6 = Wln_RetPropDelay(p_00);
      p_00->DelayMax = iVar6;
      t.pArray._4_4_ = 0;
      bVar3 = true;
    }
    DelayMaxPrev = Abc_MinInt(DelayMaxPrev,p_00->DelayMax);
    if (fVerbose != 0) {
      printf("\n");
    }
    Wln_RetAddToMoves(p_00,p_03,p_00->DelayMax,t.pArray._4_4_,fPrevBwd,fSkipSimple,fVerbose);
    if (fVerbose != 0) {
      printf("Sinks: ");
      Vec_IntPrint(&p_00->vSinks);
      printf("Sources: ");
      Vec_IntPrint(&p_00->vSources);
    }
    if (p_00->DelayMax < iVar5) {
      if (0 < DelayBest) {
        fForward = fForward + 1;
      }
      DelayBest = 0;
    }
    else {
      DelayBest = DelayBest + 1;
    }
    if ((3 < DelayBest) || (5 < fForward)) goto LAB_003f8846;
    Wln_RetFindSources(p_00);
    iVar5 = Vec_IntSize(&p_00->vEdgeLinks);
    iVar6 = Vec_IntCap(&p_00->vEdgeLinks);
    if (iVar6 < iVar5 << 1) {
      iVar5 = Vec_IntSize(&p_00->vEdgeLinks);
      Vec_IntGrow(&p_00->vEdgeLinks,iVar5 << 2);
    }
  }
  printf("Cannot retime forward and backward.\n");
LAB_003f8846:
  iVar6 = p_04->nCap;
  iVar7 = p_04->nSize;
  piVar1 = p_04->pArray;
  iVar5 = (p_00->vMoves).nSize;
  p_04->nCap = (p_00->vMoves).nCap;
  p_04->nSize = iVar5;
  p_04->pArray = (p_00->vMoves).pArray;
  (p_00->vMoves).nCap = iVar6;
  (p_00->vMoves).nSize = iVar7;
  (p_00->vMoves).pArray = piVar1;
  Wln_RetFree(p_00);
  if (fVerbose == 0) {
    iVar5 = Vec_IntSize(p_04);
    printf("Retiming instruction contains %d moves and %d total retimed objects.\n",
           (ulong)(uint)fPrevBwd,(ulong)((iVar5 + fPrevBwd * -2) - 2));
    printf("Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n",
           ((double)(int)(uVar4 - DelayMaxPrev) * 100.0) / (double)(int)uVar4,(ulong)uVar4,
           (ulong)(uint)DelayMaxPrev,(ulong)(uVar4 - DelayMaxPrev));
  }
  else {
    printf("\nThe resulting moves recorded in terms of name IDs of the NDR nodes:\n");
    Vec_IntPrint(p_04);
  }
  return p_04;
}

Assistant:

Vec_Int_t * Wln_NtkRetime( Wln_Ntk_t * pNtk, int fSkipSimple, int fVerbose )
{
    Wln_Ret_t * p = Wln_RetAlloc( pNtk );
    Vec_Int_t * vSources = &p->vSources;
    Vec_Int_t * vSinks   = &p->vSinks;
    Vec_Int_t * vFront   = &p->vFront;
    Vec_Int_t * vMoves   = Vec_IntAlloc(0);
    int nMoves = 0, fPrevFwd = 0, fPrevBwd = 0, nCountIncrease = 0;
    int DelayInit = 0, DelayBest = 0, nChange = 0;
    Wln_RetPrint( p, fVerbose );
    Wln_RetMarkChanges( p, NULL );
    p->DelayMax = DelayInit = DelayBest = Wln_RetPropDelay( p );
    Wln_RetFindSources( p );
    Wln_RetAddToMoves( p, NULL, p->DelayMax, 0, nMoves, fSkipSimple, fVerbose );
    while ( Vec_IntSize(vSources) || Vec_IntSize(vSinks) )
    {
        int DelayMaxPrev = p->DelayMax;
        int fForward  = Vec_IntSize(vSources) && Wln_RetCheckForward( p, vSources );
        int fBackward = Vec_IntSize(vSinks)   && Wln_RetCheckBackward( p, vSinks );
        Vec_IntSort( vSources, 0 );
        Vec_IntSort( vSinks, 0 );

        if ( !fForward && !fBackward )
        {
            printf( "Cannot retime forward and backward.\n" );
            break;
        }
        if ( Vec_IntTwoCountCommon(vSources, vSinks) )
        {
            printf( "Cannot reduce delay by retiming.\n" );
            break;
        }
        nMoves++;
        Vec_IntClear( vFront );
        if ( (fPrevFwd && fForward) || (!(fPrevBwd && fBackward) && ((fForward && !fBackward) || (fForward && fBackward && Vec_IntSize(vSources) < Vec_IntSize(vSinks)))) )
        {
            Vec_IntAppend( vFront, vSources );
            Wln_RetMarkChanges( p, vFront );
            Wln_RetRetimeForward( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 1, fBackward = 0;
            fPrevFwd = 1;
        }
        else
        {
            Vec_IntAppend( vFront, vSinks );
            Wln_RetRetimeBackward( p, vFront );
            Wln_RetMarkChanges( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 0, fBackward = 1;
            fPrevBwd = 1;
        }
        DelayBest = Abc_MinInt( DelayBest, p->DelayMax );
        //Wln_RetPrint( p );
        if ( fVerbose )
            printf( "\n" );
        Wln_RetAddToMoves( p, vFront, p->DelayMax, fForward, nMoves, fSkipSimple, fVerbose );
        if ( fVerbose )
        {
            printf( "Sinks: " );
            Vec_IntPrint( &p->vSinks );
            printf( "Sources: " );
            Vec_IntPrint( &p->vSources );
        }
        if ( p->DelayMax >= DelayMaxPrev )
            nCountIncrease++;
        else
        {
            if ( nCountIncrease > 0 )
                nChange++;
            nCountIncrease = 0;
        }
        if ( nCountIncrease > 3 )
            break;
        if ( nChange > 5 )
            break;
        Wln_RetFindSources( p );
        if ( 2*Vec_IntSize(&p->vEdgeLinks) > Vec_IntCap(&p->vEdgeLinks) )
            Vec_IntGrow( &p->vEdgeLinks, 4*Vec_IntSize(&p->vEdgeLinks) );
    }
    ABC_SWAP( Vec_Int_t, *vMoves, p->vMoves );
    Wln_RetFree( p );
    if ( fVerbose )
    {
        printf( "\nThe resulting moves recorded in terms of name IDs of the NDR nodes:\n" );
        Vec_IntPrint( vMoves );
    }
    else
    {
        printf( "Retiming instruction contains %d moves and %d total retimed objects.\n", nMoves, Vec_IntSize(vMoves)-2*nMoves-2 );
        printf( "Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n", 
            DelayInit, DelayBest, DelayInit - DelayBest, 100.0 * (DelayInit - DelayBest) / DelayInit );
    }
    return vMoves;
}